

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless.c
# Opt level: O1

void VP8LInverseTransform
               (VP8LTransform *transform,int row_start,int row_end,uint32_t *in,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  VP8LTransform *pVVar3;
  uint uVar4;
  int iVar5;
  uint32_t *puVar6;
  byte bVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint *puVar11;
  long lVar12;
  long lVar13;
  uint *puVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  VP8LMultipliers local_7c;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  uint *local_68;
  VP8LTransform *local_60;
  long local_58;
  uint32_t *local_50;
  uint32_t *local_48;
  long local_40;
  uint32_t *local_38;
  
  if (transform->type_ < 4) {
    uVar16 = transform->xsize_;
    lVar12 = (long)(int)uVar16;
    local_78 = row_end;
    local_40 = lVar12;
    switch(transform->type_) {
    case PREDICTOR_TRANSFORM:
      puVar11 = out;
      uVar4 = row_start;
      if (row_start == 0) {
        uVar4 = *in - 0x1000000;
        *out = uVar4;
        if (1 < (int)uVar16) {
          uVar8 = 0;
          do {
            uVar4 = (uVar4 & 0xff00ff) + (in[uVar8 + 1] & 0xff00ff) & 0xff00ff |
                    (uVar4 & 0xff00ff00) + (in[uVar8 + 1] & 0xff00ff00) & 0xff00ff00;
            out[uVar8 + 1] = uVar4;
            uVar8 = uVar8 + 1;
          } while (uVar16 - 1 != uVar8);
        }
        in = in + lVar12;
        puVar11 = out + lVar12;
        uVar4 = 1;
      }
      bVar7 = (byte)transform->bits_;
      uVar10 = 1 << (bVar7 & 0x1f);
      puVar6 = (uint32_t *)(ulong)uVar10;
      local_74 = (uVar10 + uVar16) - 1 >> (bVar7 & 0x1f);
      lVar13 = lVar12;
      local_6c = row_start;
      local_60 = transform;
      local_38 = out;
      if ((int)uVar4 < row_end) {
        local_68 = transform->data_ + (int)(((int)uVar4 >> (bVar7 & 0x1f)) * local_74);
        local_58 = CONCAT44(local_58._4_4_,uVar10 - 1);
        uVar10 = -uVar10;
        local_50 = (uint32_t *)CONCAT44(local_50._4_4_,uVar10);
        local_48 = puVar6;
        do {
          *puVar11 = (puVar11[-lVar12] & 0xff00ff) + (*in & 0xff00ff) & 0xff00ff |
                     (puVar11[-lVar12] & 0xff00ff00) + (*in & 0xff00ff00) & 0xff00ff00;
          local_70 = uVar4;
          if (1 < (int)lVar13) {
            puVar14 = local_68;
            uVar16 = 1;
            do {
              uVar4 = *puVar14;
              puVar14 = puVar14 + 1;
              uVar17 = (uVar16 & uVar10) + (int)puVar6;
              uVar9 = (uint)lVar13;
              if ((int)uVar17 < (int)(uint)lVar13) {
                uVar9 = uVar17;
              }
              (**(code **)((long)VP8LPredictorsAdd + (ulong)(uVar4 >> 5 & 0x78)))
                        (in + (int)uVar16,puVar11 + ((int)uVar16 - lVar12),uVar9 - uVar16);
              puVar6 = local_48;
              lVar13 = local_40;
              uVar10 = (uint)local_50;
              uVar16 = uVar9;
            } while ((int)uVar17 < (int)local_40);
          }
          in = in + lVar13;
          uVar4 = local_70 + 1;
          uVar16 = 0;
          if (((uint)local_58 & uVar4) == 0) {
            uVar16 = local_74;
          }
          puVar11 = puVar11 + lVar13;
          local_68 = local_68 + (int)uVar16;
        } while (uVar4 != local_78);
      }
      if (local_60->ysize_ != local_78) {
        memcpy(local_38 + -lVar13,local_38 + (int)((~local_6c + local_78) * (int)lVar13),lVar13 * 4)
        ;
        return;
      }
      break;
    case CROSS_COLOR_TRANSFORM:
      bVar7 = (byte)transform->bits_;
      iVar15 = 1 << (bVar7 & 0x1f);
      uVar4 = (uVar16 + iVar15) - 1 >> (bVar7 & 0x1f);
      local_68 = (uint *)CONCAT44(local_68._4_4_,uVar4);
      if (row_start < row_end) {
        local_70 = iVar15 - 1;
        local_74 = -iVar15 & uVar16;
        puVar6 = transform->data_ + (int)((row_start >> (bVar7 & 0x1f)) * uVar4);
        local_58 = (long)(int)local_74;
        local_60 = (VP8LTransform *)(long)(int)(uVar16 - local_74);
        do {
          local_6c = row_start;
          local_50 = puVar6;
          local_48 = in;
          if (0 < (int)local_74) {
            puVar1 = in + local_58;
            do {
              uVar2 = *puVar6;
              puVar6 = puVar6 + 1;
              local_7c._0_2_ = SUB42(uVar2,0);
              local_7c.red_to_blue_ = (uint8_t)(uVar2 >> 0x10);
              (*VP8LTransformColorInverse)(&local_7c,in,iVar15,out);
              in = in + iVar15;
              out = out + iVar15;
            } while (in < puVar1);
          }
          pVVar3 = local_60;
          if (in < local_48 + local_40) {
            local_7c._0_2_ = SUB42(*puVar6,0);
            local_7c.red_to_blue_ = (uint8_t)(*puVar6 >> 0x10);
            (*VP8LTransformColorInverse)(&local_7c,in,(int)local_60,out);
            in = in + (long)pVVar3;
            out = out + (long)pVVar3;
          }
          row_start = local_6c + 1;
          iVar5 = 0;
          if ((local_70 & row_start) == 0) {
            iVar5 = (int)local_68;
          }
          puVar6 = local_50 + iVar5;
        } while (row_start != local_78);
      }
      break;
    case SUBTRACT_GREEN_TRANSFORM:
      (*VP8LAddGreenToBlueAndRed)(in,(row_end - row_start) * uVar16,out);
      return;
    case COLOR_INDEXING_TRANSFORM:
      if ((in == out) && (0 < transform->bits_)) {
        bVar7 = (byte)transform->bits_;
        lVar12 = (long)(int)((((1 << (bVar7 & 0x1f)) + uVar16) - 1 >> (bVar7 & 0x1f)) *
                            (row_end - row_start));
        in = out + ((int)(uVar16 * (row_end - row_start)) - lVar12);
        memmove(in,out,lVar12 * 4);
      }
      ColorIndexInverseTransform_C(transform,row_start,row_end,in,out);
      return;
    }
  }
  return;
}

Assistant:

void VP8LInverseTransform(const VP8LTransform* const transform,
                          int row_start, int row_end,
                          const uint32_t* const in, uint32_t* const out) {
  const int width = transform->xsize_;
  assert(row_start < row_end);
  assert(row_end <= transform->ysize_);
  switch (transform->type_) {
    case SUBTRACT_GREEN_TRANSFORM:
      VP8LAddGreenToBlueAndRed(in, (row_end - row_start) * width, out);
      break;
    case PREDICTOR_TRANSFORM:
      PredictorInverseTransform_C(transform, row_start, row_end, in, out);
      if (row_end != transform->ysize_) {
        // The last predicted row in this iteration will be the top-pred row
        // for the first row in next iteration.
        memcpy(out - width, out + (row_end - row_start - 1) * width,
               width * sizeof(*out));
      }
      break;
    case CROSS_COLOR_TRANSFORM:
      ColorSpaceInverseTransform_C(transform, row_start, row_end, in, out);
      break;
    case COLOR_INDEXING_TRANSFORM:
      if (in == out && transform->bits_ > 0) {
        // Move packed pixels to the end of unpacked region, so that unpacking
        // can occur seamlessly.
        // Also, note that this is the only transform that applies on
        // the effective width of VP8LSubSampleSize(xsize_, bits_). All other
        // transforms work on effective width of xsize_.
        const int out_stride = (row_end - row_start) * width;
        const int in_stride = (row_end - row_start) *
            VP8LSubSampleSize(transform->xsize_, transform->bits_);
        uint32_t* const src = out + out_stride - in_stride;
        memmove(src, out, in_stride * sizeof(*src));
        ColorIndexInverseTransform_C(transform, row_start, row_end, src, out);
      } else {
        ColorIndexInverseTransform_C(transform, row_start, row_end, in, out);
      }
      break;
  }
}